

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall
wasm::BinaryInstWriter::visitStringMeasure(BinaryInstWriter *this,StringMeasure *curr)

{
  U32LEB x;
  
  BufferWithRandomAccess::operator<<(this->o,-5);
  x.value = 0x83;
  if (curr->op != StringMeasureUTF8) {
    if (curr->op != StringMeasureWTF16) {
      handle_unreachable("invalid string.new*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0xa0d);
    }
    x.value = 0x85;
  }
  BufferWithRandomAccess::operator<<(this->o,x);
  return;
}

Assistant:

void BinaryInstWriter::visitStringMeasure(StringMeasure* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringMeasureUTF8:
      o << U32LEB(BinaryConsts::StringMeasureUTF8);
      break;
    case StringMeasureWTF16:
      o << U32LEB(BinaryConsts::StringMeasureWTF16);
      break;
    default:
      WASM_UNREACHABLE("invalid string.new*");
  }
}